

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngine.cpp
# Opt level: O1

void __thiscall llbuild::core::BuildEngine::cancelBuild(BuildEngine *this)

{
  void *pvVar1;
  int iVar2;
  pointer pvVar3;
  iterator local_30;
  
  pvVar1 = this->impl;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)((long)pvVar1 + 0x90));
  if (iVar2 == 0) {
    if ((*(byte *)((long)pvVar1 + 200) & 1) == 0) {
      local_30 = (iterator)
                 llvm::detail::
                 DenseSetImpl<llbuild::core::CancellationDelegate_*,_llvm::DenseMap<llbuild::core::CancellationDelegate_*,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llbuild::core::CancellationDelegate_*>,_llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate_*>_>,_llvm::DenseMapInfo<llbuild::core::CancellationDelegate_*>_>
                 ::begin((DenseSetImpl<llbuild::core::CancellationDelegate_*,_llvm::DenseMap<llbuild::core::CancellationDelegate_*,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llbuild::core::CancellationDelegate_*>,_llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate_*>_>,_llvm::DenseMapInfo<llbuild::core::CancellationDelegate_*>_>
                          *)((long)pvVar1 + 0xf8));
      pvVar3 = (pointer)((ulong)*(uint *)((long)pvVar1 + 0x108) * 8 + *(long *)((long)pvVar1 + 0xf8)
                        );
      if (local_30.Ptr != pvVar3) {
        do {
          (*(local_30.Ptr)->key->_vptr_CancellationDelegate[2])();
          local_30.Ptr = local_30.Ptr + 1;
          llvm::
          DenseMapIterator<llbuild::core::CancellationDelegate_*,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llbuild::core::CancellationDelegate_*>,_llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate_*>,_false>
          ::AdvancePastEmptyBuckets(&local_30);
        } while (local_30.Ptr != pvVar3);
      }
    }
    LOCK();
    *(undefined1 *)((long)pvVar1 + 200) = 1;
    UNLOCK();
    if (*(long **)((long)pvVar1 + 0xb8) != (long *)0x0) {
      (**(code **)(**(long **)((long)pvVar1 + 0xb8) + 0x18))();
    }
    pthread_mutex_unlock((pthread_mutex_t *)((long)pvVar1 + 0x90));
    return;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

void BuildEngine::cancelBuild() {
  static_cast<BuildEngineImpl*>(impl)->cancelBuild();
}